

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXBigInteger.cpp
# Opt level: O0

void ZXing::DivideWithRemainder(Magnitude *a,Magnitude *b,Magnitude *qq,Magnitude *rr)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  Block BVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar7;
  value_type vVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RCX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  bool borrowOut;
  unsigned_long temp;
  size_t j;
  bool borrowIn;
  size_t k;
  size_t i2;
  size_t i;
  Magnitude subtractBuf;
  Magnitude *r;
  Magnitude *q;
  Magnitude tmp2;
  Magnitude tmp;
  value_type_conflict7 *in_stack_fffffffffffffe98;
  uint7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffea8;
  allocator_type *in_stack_fffffffffffffeb0;
  size_type in_stack_fffffffffffffeb8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffed0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_d8;
  bool local_c9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff38;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff40;
  ulong uVar9;
  ulong uVar10;
  bool local_b1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_b0;
  long local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  undefined8 local_78;
  undefined4 local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b4174);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b4181);
  if ((local_18 == local_8) || (local_18 == local_10)) {
    local_d8 = &local_38;
  }
  else {
    local_d8 = local_18;
  }
  local_58 = local_d8;
  if (local_20 == local_10) {
    local_e0 = &local_50;
  }
  else {
    local_e0 = local_20;
  }
  local_60 = local_e0;
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffeb0);
  if (!bVar1) {
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_8);
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10);
    if (sVar4 <= sVar3) {
      if (local_60 != local_8) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  (in_stack_fffffffffffffed0,
                   CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      }
      local_78 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                 in_stack_fffffffffffffe98);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_60);
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2b4349);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2b436f);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_8);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      local_a0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_58);
      while (local_a0 != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
        local_a0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   ((long)&local_a0[-1].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7);
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (local_58,(size_type)local_a0);
        *pvVar5 = 0;
        local_a8 = 0x40;
        while (local_a8 != 0) {
          local_a8 = local_a8 + -1;
          local_b1 = false;
          uVar9 = 0;
          local_b0 = local_a0;
          while (uVar10 = uVar9,
                sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10),
                uVar9 <= sVar3) {
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (local_60,(size_type)local_b0);
            vVar8 = *pvVar5;
            BVar6 = GetShiftedBlock(in_stack_fffffffffffffed0,
                                    CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                                    (size_t)in_stack_fffffffffffffec0);
            in_stack_fffffffffffffed0 =
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(vVar8 - BVar6);
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (local_60,(size_type)local_b0);
            local_c9 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar5 <
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(vVar8 - BVar6);
            if (local_b1 != false) {
              local_c9 = local_c9 ||
                         in_stack_fffffffffffffed0 ==
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
              in_stack_fffffffffffffed0 =
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   ((long)&in_stack_fffffffffffffed0[-1].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7);
            }
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&local_90,(size_type)local_b0);
            *pvVar5 = (value_type)in_stack_fffffffffffffed0;
            local_b1 = local_c9;
            local_b0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       ((long)&(local_b0->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start + 1);
            uVar9 = uVar10 + 1;
          }
          while( true ) {
            in_stack_fffffffffffffec0 = local_b0;
            pvVar7 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_8);
            in_stack_fffffffffffffecf = false;
            if (in_stack_fffffffffffffec0 < pvVar7) {
              in_stack_fffffffffffffecf = local_b1;
            }
            if ((bool)in_stack_fffffffffffffecf == false) break;
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (local_60,(size_type)local_b0);
            local_b1 = *pvVar5 == 0;
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (local_60,(size_type)local_b0);
            vVar8 = *pvVar5 - 1;
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (&local_90,(size_type)local_b0);
            *pvVar5 = vVar8;
            local_b0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       ((long)&(local_b0->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start + 1);
          }
          if (local_b1 == false) {
            in_stack_fffffffffffffeb0 = (allocator_type *)(1L << ((byte)local_a8 & 0x3f));
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (local_58,(size_type)local_a0);
            *pvVar5 = (ulong)in_stack_fffffffffffffeb0 | *pvVar5;
            while (local_a0 < local_b0) {
              local_b0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         ((long)&local_b0[-1].
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (&local_90,(size_type)local_b0);
              in_stack_fffffffffffffea8 =
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar5;
              pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                 (local_60,(size_type)local_b0);
              *pvVar5 = (value_type)in_stack_fffffffffffffea8;
            }
          }
        }
      }
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
      if (*pvVar5 == 0) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b47a0);
      }
      while( true ) {
        bVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffeb0);
        bVar1 = false;
        if (!bVar2) {
          pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              (ulong)in_stack_fffffffffffffea0);
          bVar1 = *pvVar5 == 0;
        }
        if (!bVar1) break;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b47eb);
      }
      if (local_18 != local_58) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      }
      if (local_20 != local_60) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffeb0)
      ;
      local_70 = 0;
      goto LAB_002b4853;
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2b426b);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  local_70 = 1;
LAB_002b4853:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffeb0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffeb0);
  return;
}

Assistant:

static void DivideWithRemainder(const Magnitude& a, const Magnitude& b, Magnitude& qq, Magnitude& rr)
{
	/* Defending against aliased calls is more complex than usual because we
	* are writing to both r and q.
	*
	* It would be silly to try to write quotient and remainder to the
	* same variable.  Rule that out right away. */
	assert(&rr != &qq);

	Magnitude tmp, tmp2;
	Magnitude& q = &qq == &a || &qq == &b ? tmp : qq;
	Magnitude& r = &rr == &b ? tmp2 : rr;

	/*
	* Knuth's definition of mod (which this function uses) is somewhat
	* different from the C++ definition of % in case of division by 0.
	*
	* We let a / 0 == 0 (it doesn't matter much) and a % 0 == a, no
	* exceptions thrown.  This allows us to preserve both Knuth's demand
	* that a mod 0 == a and the useful property that
	* (a / b) * b + (a % b) == a.
	*/
	/*
	* If a.len < b.len, then a < b, and we can be sure that b doesn't go into
	* a at all.  The quotient is 0 and *this is already the remainder (so leave it alone).
	*/
	if (b.empty() || a.size() < b.size()) {
		qq.clear();
		rr = a;
		return;
	}

	// At this point we know a.len >= b.len > 0.  (Whew!)

	/*
	* Overall method:
	*
	* For each appropriate i and i2, decreasing:
	*    Subtract (b << (i blocks and i2 bits)) from *this, storing the
	*      result in subtractBuf.
	*    If the subtraction succeeds with a nonnegative result:
	*        Turn on bit i2 of block i of the quotient q.
	*        Copy subtractBuf back into *this.
	*    Otherwise bit i2 of block i remains off, and *this is unchanged.
	*
	* Eventually q will contain the entire quotient, and *this will
	* be left with the remainder.
	*
	* subtractBuf[x] corresponds to blk[x], not blk[x+i], since 2005.01.11.
	* But on a single iteration, we don't touch the i lowest blocks of blk
	* (and don't use those of subtractBuf) because these blocks are
	* unaffected by the subtraction: we are subtracting
	* (b << (i blocks and i2 bits)), which ends in at least `i' zero
	* blocks. */

	/*
	* Make sure we have an extra zero block just past the value.
	*
	* When we attempt a subtraction, we might shift `b' so
	* its first block begins a few bits left of the dividend,
	* and then we'll try to compare these extra bits with
	* a nonexistent block to the left of the dividend.  The
	* extra zero block ensures sensible behavior; we need
	* an extra block in `subtractBuf' for exactly the same reason.
	*/
	if (&r != &a) {
		r.reserve(a.size() + 1);
		r = a;
	}
	r.push_back(0);

	Magnitude subtractBuf(r.size());

	// Set preliminary length for quotient and make room
	q.resize(a.size() - b.size() + 1);

	// For each possible left-shift of b in blocks...
	size_t i = q.size();
	while (i > 0) {
		i--;
		// For each possible left-shift of b in bits...
		// (Remember, N is the number of bits in a Blk.)
		q[i] = 0;
		size_t i2 = NB_BITS;
		while (i2 > 0) {
			i2--;
			/*
			* Subtract b, shifted left i blocks and i2 bits, from *this,
			* and store the answer in subtractBuf.  In the for loop, `k == i + j'.
			*
			* Compare this to the middle section of `multiply'.  They
			* are in many ways analogous.  See especially the discussion
			* of `getShiftedBlock'.
			*/
			size_t k = i;
			bool borrowIn = false;
			for (size_t j = 0; j <= b.size(); ++j, ++k) {
				auto temp = r[k] - GetShiftedBlock(b, j, i2);
				bool borrowOut = (temp > r[k]);
				if (borrowIn) {
					borrowOut |= (temp == 0);
					temp--;
				}
				// Since 2005.01.11, indices of `subtractBuf' directly match those of `blk', so use `k'.
				subtractBuf[k] = temp;
				borrowIn = borrowOut;
			}
			// No more extra iteration to deal with `bHigh'.
			// Roll-over a borrow as necessary.
			for (; k < a.size() && borrowIn; k++) {
				borrowIn = (r[k] == 0);
				subtractBuf[k] = r[k] - 1;
			}
			/*
			* If the subtraction was performed successfully (!borrowIn),
			* set bit i2 in block i of the quotient.
			*
			* Then, copy the portion of subtractBuf filled by the subtraction
			* back to *this.  This portion starts with block i and ends--
			* where?  Not necessarily at block `i + b.len'!  Well, we
			* increased k every time we saved a block into subtractBuf, so
			* the region of subtractBuf we copy is just [i, k).
			*/
			if (!borrowIn) {
				q[i] |= (Block(1) << i2);
				while (k > i) {
					k--;
					r[k] = subtractBuf[k];
				}
			}
		}
	}
	// Zap possible leading zero in quotient
	if (q.back() == 0)
		q.pop_back();
	
	// Zap any/all leading zeros in remainder
	while (!r.empty() && r.back() == 0) {
		r.pop_back();
	}

	if (&qq != &q)
		qq = std::move(q);
	if (&rr != &r)
		rr = std::move(r);
}